

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.hpp
# Opt level: O2

void __thiscall
ruckig::BrakeProfile::finalize_second_order(BrakeProfile *this,double *ps,double *vs,double *as)

{
  double dVar1;
  double dVar2;
  double dVar3;
  tuple<double,_double,_double> local_38;
  double *local_18;
  double *local_10;
  double *local_8;
  
  dVar1 = (this->t)._M_elems[0];
  if (0.0 < dVar1) {
    this->duration = dVar1;
    (this->p)._M_elems[0] = *ps;
    dVar2 = *vs;
    (this->v)._M_elems[0] = dVar2;
    dVar3 = (this->a)._M_elems[0];
    local_38.super__Tuple_impl<0UL,_double,_double,_double>.super__Head_base<0UL,_double,_false>.
    _M_head_impl = (((dVar1 * 0.0) / 6.0 + dVar3 * 0.5) * dVar1 + dVar2) * dVar1 + *ps;
    local_38.super__Tuple_impl<0UL,_double,_double,_double>.super__Tuple_impl<1UL,_double,_double>.
    super__Tuple_impl<2UL,_double>.super__Head_base<2UL,_double,_false>._M_head_impl =
         (_Head_base<2UL,_double,_false>)(dVar3 + dVar1 * 0.0);
    local_38.super__Tuple_impl<0UL,_double,_double,_double>.super__Tuple_impl<1UL,_double,_double>.
    super__Head_base<1UL,_double,_false>._M_head_impl = dVar2 + (dVar1 * 0.0 * 0.5 + dVar3) * dVar1;
    local_18 = as;
    local_10 = vs;
    local_8 = ps;
    std::tuple<double&,double&,double&>::operator=
              ((tuple<double&,double&,double&> *)&local_18,&local_38);
    return;
  }
  this->duration = 0.0;
  return;
}

Assistant:

void finalize_second_order(double& ps, double& vs, double& as) {
        if (t[0] <= 0.0) {
            duration = 0.0;
            return;
        }

        duration = t[0];
        p[0] = ps;
        v[0] = vs;
        std::tie(ps, vs, as) = integrate(t[0], ps, vs, a[0], 0.0);
    }